

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O1

void __thiscall nesvis::PpuWidget::draw_nametables(PpuWidget *this)

{
  bool bVar1;
  PpuRegisters *pPVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint __val;
  string tab_name;
  string __str;
  size_type *local_70;
  size_type local_60;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pPVar2 = n_e_s::nes::Nes::ppu_registers(this->nes_);
  __val = 0;
  ImGui::Text("%s: %i","Pattern table used: ",(ulong)((pPVar2->ctrl).value_ >> 4 & 1));
  bVar1 = ImGui::BeginTabBar("MyTabBar",0);
  if (bVar1) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_50,1,'-');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_50._M_dataplus._M_p,1,__val);
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_50,0,0,"Nametable ",10);
      local_70 = (size_type *)(pbVar3->_M_dataplus)._M_p;
      paVar4 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70 == paVar4) {
        local_60 = paVar4->_M_allocated_capacity;
        uStack_58 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_70 = &local_60;
      }
      else {
        local_60 = paVar4->_M_allocated_capacity;
      }
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar1 = ImGui::BeginTabItem((char *)local_70,(bool *)0x0,0);
      if (bVar1) {
        draw_nametable(this,(uint16_t)__val);
        ImGui::EndTabItem();
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      __val = __val + 1;
    } while (__val != 4);
    ImGui::EndTabBar();
  }
  return;
}

Assistant:

void PpuWidget::draw_nametables() {
    const auto reg = nes_->ppu_registers();
    const int pattern_table = reg.ctrl.is_set(4u) ? 1 : 0;
    ImGui::Text("%s: %i", "Pattern table used: ", pattern_table);

    if (ImGui::BeginTabBar("MyTabBar")) {
        for (auto nametable = 0; nametable < 4; ++nametable) {
            const std::string tab_name =
                    "Nametable " + std::to_string(nametable);
            if (ImGui::BeginTabItem(tab_name.c_str())) {
                draw_nametable(nametable);
                ImGui::EndTabItem();
            }
        }
        ImGui::EndTabBar();
    }
}